

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QAnimationTimer::stopTimer(QAnimationTimer *this)

{
  bool bVar1;
  bool bVar2;
  qsizetype qVar3;
  QAbstractAnimationTimer *in_RDI;
  bool pendingStart;
  QAbstractAnimationTimer *timer;
  
  *(undefined1 *)((long)&in_RDI[1].super_QObject.d_ptr.d + 6) = 0;
  bVar1 = false;
  timer = in_RDI;
  if (((ulong)in_RDI[1].super_QObject.d_ptr.d & 0x10000000000) != 0) {
    qVar3 = QList<QAbstractAnimation_*>::size
                      ((QList<QAbstractAnimation_*> *)&in_RDI[2].isRegistered);
    bVar1 = 0 < qVar3;
  }
  bVar2 = QList<QAbstractAnimation_*>::isEmpty((QList<QAbstractAnimation_*> *)0x66a185);
  if ((bVar2) && (!bVar1)) {
    QUnifiedTimer::resumeAnimationTimer(in_RDI);
    QUnifiedTimer::stopAnimationTimer(timer);
    in_RDI[1].super_QObject._vptr_QObject = (_func_int **)0x0;
  }
  return;
}

Assistant:

void QAnimationTimer::stopTimer()
{
    stopTimerPending = false;
    bool pendingStart = startAnimationPending && animationsToStart.size() > 0;
    if (animations.isEmpty() && !pendingStart) {
        QUnifiedTimer::resumeAnimationTimer(this);
        QUnifiedTimer::stopAnimationTimer(this);
        // invalidate the start reference time
        lastTick = 0;
    }
}